

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TeamCityReporter::testGroupStarting(TeamCityReporter *this,GroupInfo *groupInfo)

{
  ostream *poVar1;
  string local_38;
  GroupInfo *local_18;
  GroupInfo *groupInfo_local;
  TeamCityReporter *this_local;
  
  local_18 = groupInfo;
  groupInfo_local = (GroupInfo *)this;
  StreamingReporterBase::testGroupStarting(&this->super_StreamingReporterBase,groupInfo);
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           "##teamcity[testSuiteStarted name=\'");
  anon_unknown_23::escape(&local_38,&local_18->name);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void TeamCityReporter::testGroupStarting(GroupInfo const &groupInfo) {
        StreamingReporterBase::testGroupStarting(groupInfo);
        stream << "##teamcity[testSuiteStarted name='"
            << escape(groupInfo.name) << "']\n";
    }